

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  char *pcVar2;
  float *pfVar3;
  undefined8 in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int i_1;
  float *m_1;
  float *w_2;
  int q_1;
  float sum_1;
  int p_1;
  Mat weights [1];
  ParamDict pd_1;
  float top_rescale;
  int i;
  char *m;
  char *w_1;
  int q;
  int *out;
  int sum;
  int p;
  ParamDict pd;
  Mat bottom_blob_int8;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffff388;
  undefined4 in_stack_fffffffffffff38c;
  Mat *in_stack_fffffffffffff390;
  Mat *this_00;
  Mat *in_stack_fffffffffffff398;
  undefined4 in_stack_fffffffffffff3a0;
  int in_stack_fffffffffffff3a4;
  int in_stack_fffffffffffff3a8;
  int in_stack_fffffffffffff3ac;
  Mat *in_stack_fffffffffffff3b0;
  Mat *local_c28;
  ParamDict *in_stack_fffffffffffff3e0;
  long *plVar4;
  Mat *local_c00;
  int local_bc4;
  Mat local_bc0;
  Mat *local_b88;
  float *local_b80;
  int local_b74;
  float local_b70;
  int local_b6c;
  undefined1 local_b68 [16];
  Mat local_b58;
  undefined1 auStack_b20 [1304];
  float local_608;
  int local_604;
  Mat local_600;
  char *local_5c8;
  char *local_5c0;
  int local_5b4;
  int *local_5b0;
  int local_5a8;
  int local_5a4;
  ParamDict local_5a0;
  undefined4 local_90;
  Mat local_80;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  Mat *local_20;
  long local_18;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x24);
  local_30 = *(int *)(in_RSI + 0x28);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = local_2c * local_30;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  Mat::create(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
              CONCAT44(in_stack_fffffffffffff3a4,in_stack_fffffffffffff3a0),
              (Allocator *)in_stack_fffffffffffff398);
  bVar1 = Mat::empty(in_stack_fffffffffffff390);
  if (bVar1) {
    local_4 = -100;
  }
  else if ((*(byte *)(in_RDI + 0x108) & 1) == 0) {
    for (local_b6c = 0; local_b6c < *(int *)(in_RDI + 0x80); local_b6c = local_b6c + 1) {
      local_b70 = 0.0;
      if (*(int *)(in_RDI + 0x84) != 0) {
        pfVar3 = Mat::operator[]((Mat *)(in_RDI + 200),local_b6c);
        local_b70 = *pfVar3;
      }
      for (local_b74 = 0; local_b74 < local_34; local_b74 = local_b74 + 1) {
        local_b80 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x90));
        local_b80 = local_b80 +
                    (long)(local_44 * local_34 * local_b6c) + (long)(local_44 * local_b74);
        this_00 = &local_bc0;
        Mat::channel(in_stack_fffffffffffff398,(int)((ulong)this_00 >> 0x20));
        in_stack_fffffffffffff398 = (Mat *)Mat::operator_cast_to_float_(this_00);
        Mat::~Mat((Mat *)0x11d981);
        for (local_bc4 = 0; local_bc4 < local_44; local_bc4 = local_bc4 + 1) {
          local_b70 = *(float *)((long)&in_stack_fffffffffffff398->data + (long)local_bc4 * 4) *
                      local_b80[local_bc4] + local_b70;
        }
        local_b88 = in_stack_fffffffffffff398;
      }
      pfVar3 = Mat::operator[](local_20,local_b6c);
      *pfVar3 = local_b70;
    }
    local_4 = 0;
  }
  else {
    Mat::Mat(&local_80);
    Mat::create(in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,in_stack_fffffffffffff3a8,
                in_stack_fffffffffffff3a4,(size_t)in_stack_fffffffffffff398,
                (Allocator *)in_stack_fffffffffffff390);
    bVar1 = Mat::empty(in_stack_fffffffffffff390);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      ParamDict::ParamDict(in_stack_fffffffffffff3e0);
      ParamDict::set(&local_5a0,0,*(float *)(in_RDI + 0x104));
      (**(code **)(**(long **)(in_RDI + 0x110) + 0x10))(*(long **)(in_RDI + 0x110),&local_5a0);
      (**(code **)(**(long **)(in_RDI + 0x110) + 0x28))
                (*(long **)(in_RDI + 0x110),local_18,&local_80,local_28);
      ParamDict::~ParamDict
                ((ParamDict *)CONCAT44(in_stack_fffffffffffff3a4,in_stack_fffffffffffff3a0));
      for (local_5a4 = 0; local_5a4 < *(int *)(in_RDI + 0x80); local_5a4 = local_5a4 + 1) {
        local_5a8 = 0;
        local_5b0 = Mat::operator_cast_to_int_(local_20);
        for (local_5b4 = 0; local_5b4 < local_34; local_5b4 = local_5b4 + 1) {
          local_5c0 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0x90));
          local_5c0 = local_5c0 +
                      (long)(local_44 * local_5b4) + (long)(local_44 * local_34 * local_5a4);
          Mat::channel(in_stack_fffffffffffff398,(int)((ulong)in_stack_fffffffffffff390 >> 0x20));
          pcVar2 = Mat::operator_cast_to_signed_char_(&local_600);
          Mat::~Mat((Mat *)0x11d473);
          for (local_604 = 0; local_604 < local_44; local_604 = local_604 + 1) {
            local_5a8 = (int)pcVar2[local_604] * (int)local_5c0[local_604] + local_5a8;
          }
          local_5c8 = pcVar2;
        }
        local_5b0[local_5a4] = local_5a8;
      }
      local_608 = 1.0 / (*(float *)(in_RDI + 0x104) * *(float *)(in_RDI + 0x100));
      ParamDict::ParamDict(in_stack_fffffffffffff3e0);
      ParamDict::set((ParamDict *)(auStack_b20 + 8),0,local_608);
      ParamDict::set((ParamDict *)(auStack_b20 + 8),1,*(int *)(in_RDI + 0x84));
      ParamDict::set((ParamDict *)(auStack_b20 + 8),2,*(int *)(in_RDI + 0x80));
      (**(code **)(**(long **)(in_RDI + 0x118) + 0x10))(*(long **)(in_RDI + 0x118),auStack_b20 + 8);
      local_c00 = &local_b58;
      do {
        Mat::Mat(local_c00);
        local_c00 = local_c00 + 1;
      } while (local_c00 != (Mat *)auStack_b20);
      Mat::operator=(in_stack_fffffffffffff398,in_stack_fffffffffffff390);
      plVar4 = *(long **)(in_RDI + 0x118);
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffff390,
                 (Mat *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388));
      (**(code **)(*plVar4 + 0x18))(plVar4,local_b68);
      (**(code **)(**(long **)(in_RDI + 0x118) + 0x38))
                (*(long **)(in_RDI + 0x118),local_20,local_28);
      local_c28 = (Mat *)auStack_b20;
      do {
        local_c28 = local_c28 + -1;
        Mat::~Mat((Mat *)0x11d73d);
      } while (local_c28 != &local_b58);
      ParamDict::~ParamDict
                ((ParamDict *)CONCAT44(in_stack_fffffffffffff3a4,in_stack_fffffffffffff3a0));
      local_4 = 0;
    }
    local_90 = 1;
    Mat::~Mat((Mat *)0x11d850);
  }
  return local_4;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (use_int8_inference)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->forward(bottom_blob, bottom_blob_int8, opt);
        }

        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int sum = 0;
            int* out = top_blob;

            // channels
            for (int q=0; q<channels; q++)
            {
                const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
                const signed char* m = bottom_blob_int8.channel(q);

                for (int i = 0; i < size; i++)
                {
                    sum += m[i] * w[i];
                }
            }

            out[p] = sum;
        }

        // dequantize, reverse scale inplace
        {
            float top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scale);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, num_output);// bias_data_size

            dequantize->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data;

            dequantize->load_model(ModelBinFromMatArray(weights));

            dequantize->forward_inplace(top_blob, opt);
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        top_blob[p] = sum;
    }

    return 0;
}